

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xscript.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  command *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  reference pbVar5;
  string local_c0;
  string local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> source;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_58 [8];
  syntax s;
  int ret;
  char **argv_local;
  int argc_local;
  
  pcVar3 = xscript::util::singleton<xscript::framework::command>::instance();
  xscript::framework::command::init(pcVar3,(EVP_PKEY_CTX *)(ulong)(uint)argc);
  s.packages._M_h._M_single_bucket._4_4_ = 0;
  xscript::parser::syntax::syntax((syntax *)local_58);
  pcVar3 = xscript::util::singleton<xscript::framework::command>::instance();
  pvVar4 = xscript::framework::command::get_source_files_abi_cxx11_(pcVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size(pvVar4);
  pcVar3 = xscript::util::singleton<xscript::framework::command>::instance();
  pvVar4 = xscript::framework::command::get_source_files_abi_cxx11_(pcVar3);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvVar4);
  source.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(pvVar4);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&source.field_2 + 8)),
        iVar1 = s.packages._M_h._M_single_bucket._4_4_, bVar2) {
    pbVar5 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_a0,(string *)pbVar5);
    std::__cxx11::string::string((string *)&local_c0,local_a0);
    bVar2 = xscript::parser::syntax::load((syntax *)local_58,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      s.packages._M_h._M_single_bucket._4_4_ = 1;
    }
    std::__cxx11::string::~string(local_a0);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  xscript::parser::syntax::~syntax((syntax *)local_58);
  return iVar1;
}

Assistant:

int main(int argc, char* argv[]) {

    command::instance().init(argc, argv);

    /*
    lgx_token_init();

    lgx_ast_t ast;
    int ast_ok = lgx_ast_init(&ast, argv[1]);
    lgx_ast_print(&ast);
    lgx_ast_print_error(&ast);

    if (ast_ok == 0) {
        lgx_compiler_t c;
        lgx_compiler_init(&c);
        int c_ok = lgx_compiler_generate(&c, &ast);

        lgx_bc_print(c.bc.buffer, c.bc.length);
        lgx_ast_print_error(&ast);
        lgx_const_print(&c.constant);
        printf("\n\n");

        if (c_ok == 0) {
            lgx_vm_t vm;
            lgx_vm_init(&vm, &c);

            // 寻找 main 函数
            lgx_str_t mainfunc = lgx_str("main");
            lgx_symbol_t* symbol = lgx_symbol_get(ast.root, &mainfunc, -1);

            if (symbol) {
                lgx_function_t* fun  = symbol->v.v.fun;
                lgx_vm_call(&vm, fun);
            } else {
                // TODO
                // can't find main func
            }

            lgx_vm_cleanup(&vm);
        }

        lgx_compiler_cleanup(&c);
    }

    lgx_ast_cleanup(&ast);

    lgx_token_cleanup();
    */

    int ret = 0;
    syntax s;
    
    if (command::instance().get_source_files().size() == 0) {
        // TODO 交互式终端模式
    }

    // 
    for (auto source : command::instance().get_source_files()) {
        if (!s.load(source)) {
            ret = 1;
        }
    }
    
    return ret;
}